

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution.cpp
# Opt level: O1

int __thiscall ncnn::Deconvolution::load_param(Deconvolution *this,ParamDict *pd)

{
  int *piVar1;
  void *__ptr;
  Allocator *pAVar2;
  int iVar3;
  Mat local_c8;
  Mat local_78;
  
  iVar3 = ParamDict::get(pd,0,0);
  this->num_output = iVar3;
  iVar3 = ParamDict::get(pd,1,0);
  this->kernel_w = iVar3;
  iVar3 = ParamDict::get(pd,0xb,iVar3);
  this->kernel_h = iVar3;
  iVar3 = ParamDict::get(pd,2,1);
  this->dilation_w = iVar3;
  iVar3 = ParamDict::get(pd,0xc,iVar3);
  this->dilation_h = iVar3;
  iVar3 = ParamDict::get(pd,3,1);
  this->stride_w = iVar3;
  iVar3 = ParamDict::get(pd,0xd,iVar3);
  this->stride_h = iVar3;
  iVar3 = ParamDict::get(pd,4,0);
  this->pad_left = iVar3;
  iVar3 = ParamDict::get(pd,0xf,iVar3);
  this->pad_right = iVar3;
  iVar3 = ParamDict::get(pd,0xe,this->pad_left);
  this->pad_top = iVar3;
  iVar3 = ParamDict::get(pd,0x10,iVar3);
  this->pad_bottom = iVar3;
  iVar3 = ParamDict::get(pd,0x12,0);
  this->output_pad_right = iVar3;
  iVar3 = ParamDict::get(pd,0x13,iVar3);
  this->output_pad_bottom = iVar3;
  iVar3 = ParamDict::get(pd,0x14,0);
  this->output_w = iVar3;
  iVar3 = ParamDict::get(pd,0x15,iVar3);
  this->output_h = iVar3;
  iVar3 = ParamDict::get(pd,5,0);
  this->bias_term = iVar3;
  iVar3 = ParamDict::get(pd,6,0);
  this->weight_data_size = iVar3;
  iVar3 = ParamDict::get(pd,9,0);
  this->activation_type = iVar3;
  local_78.cstep = 0;
  local_78.data = (void *)0x0;
  local_78.refcount._0_4_ = 0;
  local_78.refcount._4_4_ = 0;
  local_78.elemsize._0_4_ = 0;
  local_78._20_8_ = 0;
  local_78.allocator = (Allocator *)0x0;
  local_78.dims = 0;
  local_78.w = 0;
  local_78.h = 0;
  local_78.d = 0;
  local_78.c = 0;
  ParamDict::get(&local_c8,pd,10,&local_78);
  if (&this->activation_params != &local_c8) {
    piVar1 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    piVar1 = (this->activation_params).refcount;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        __ptr = (this->activation_params).data;
        pAVar2 = (this->activation_params).allocator;
        if (pAVar2 == (Allocator *)0x0) {
          if (__ptr != (void *)0x0) {
            free(__ptr);
          }
        }
        else {
          (*pAVar2->_vptr_Allocator[3])();
        }
      }
    }
    (this->activation_params).cstep = 0;
    *(undefined8 *)((long)&(this->activation_params).refcount + 4) = 0;
    *(undefined8 *)((long)&(this->activation_params).elemsize + 4) = 0;
    (this->activation_params).data = (void *)0x0;
    (this->activation_params).refcount = (int *)0x0;
    (this->activation_params).dims = 0;
    (this->activation_params).w = 0;
    (this->activation_params).h = 0;
    (this->activation_params).d = 0;
    (this->activation_params).c = 0;
    (this->activation_params).data = local_c8.data;
    (this->activation_params).refcount =
         (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
    (this->activation_params).elemsize =
         CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize);
    (this->activation_params).elempack = local_c8.elempack;
    (this->activation_params).allocator = local_c8.allocator;
    (this->activation_params).dims = local_c8.dims;
    (this->activation_params).w = local_c8.w;
    (this->activation_params).h = local_c8.h;
    (this->activation_params).d = local_c8.d;
    (this->activation_params).c = local_c8.c;
    (this->activation_params).cstep = local_c8.cstep;
  }
  piVar1 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (local_c8.allocator == (Allocator *)0x0) {
        if (local_c8.data != (void *)0x0) {
          free(local_c8.data);
        }
      }
      else {
        (*(local_c8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_c8.cstep = 0;
  local_c8.data = (void *)0x0;
  local_c8.refcount._0_4_ = 0;
  local_c8.refcount._4_4_ = 0;
  local_c8.elemsize._0_4_ = 0;
  local_c8.elemsize._4_4_ = 0;
  local_c8.elempack = 0;
  local_c8.dims = 0;
  local_c8.w = 0;
  local_c8.h = 0;
  local_c8.d = 0;
  local_c8.c = 0;
  piVar1 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        if (local_78.data != (void *)0x0) {
          free(local_78.data);
        }
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_78.cstep = 0;
  local_78.data = (void *)0x0;
  local_78.refcount._0_4_ = 0;
  local_78.refcount._4_4_ = 0;
  local_78.elemsize._0_4_ = 0;
  local_78._20_8_ = 0;
  local_78.dims = 0;
  local_78.w = 0;
  local_78.h = 0;
  local_78.d = 0;
  local_78.c = 0;
  iVar3 = ParamDict::get(pd,0x1c,0);
  this->dynamic_weight = iVar3;
  if (iVar3 != 0) {
    (this->super_Layer).one_blob_only = false;
  }
  return 0;
}

Assistant:

int Deconvolution::load_param(const ParamDict& pd)
{
    num_output = pd.get(0, 0);
    kernel_w = pd.get(1, 0);
    kernel_h = pd.get(11, kernel_w);
    dilation_w = pd.get(2, 1);
    dilation_h = pd.get(12, dilation_w);
    stride_w = pd.get(3, 1);
    stride_h = pd.get(13, stride_w);
    pad_left = pd.get(4, 0);
    pad_right = pd.get(15, pad_left);
    pad_top = pd.get(14, pad_left);
    pad_bottom = pd.get(16, pad_top);
    output_pad_right = pd.get(18, 0);
    output_pad_bottom = pd.get(19, output_pad_right);
    output_w = pd.get(20, 0);
    output_h = pd.get(21, output_w);
    bias_term = pd.get(5, 0);
    weight_data_size = pd.get(6, 0);
    activation_type = pd.get(9, 0);
    activation_params = pd.get(10, Mat());

    dynamic_weight = pd.get(28, 0);

    if (dynamic_weight)
    {
        one_blob_only = false;
    }

    return 0;
}